

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<9,_5,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  Type in0;
  undefined1 local_3c [20];
  float local_28;
  float local_24;
  VecAccess<float,_4,_3> local_20;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,5>
              ((ShaderEvalContext *)local_3c,(int)evalCtx);
  }
  else {
    tcu::Matrix<float,_2,_2>::Matrix
              ((Matrix<float,_2,_2> *)local_3c,(float *)sr::(anonymous_namespace)::s_constInMat2x2);
  }
  local_24 = (float)local_3c._4_4_ + (float)local_3c._12_4_;
  local_3c._16_4_ = local_3c._0_4_;
  local_28 = (float)local_3c._8_4_;
  local_20.m_vector = &evalCtx->color;
  local_20.m_index[0] = 0;
  local_20.m_index[1] = 1;
  local_20.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_20,(Vector<float,_3> *)(local_3c + 0x10));
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}